

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToUniSB::map(CCharmapToUniSB *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  wchar_t ch;
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = 0;
  for (sVar4 = 0; inlen != sVar4; sVar4 = sVar4 + 1) {
    ch = *(wchar_t *)
          (&(this->super_CCharmapToUniSB_basic).field_0x20c + (ulong)(byte)inp[sVar4] * 4);
    uVar2 = 3 - (ulong)((uint)ch < 0x800);
    if (ch < L'\x80') {
      uVar2 = 1;
    }
    if (*outlen < uVar2) {
      sVar1 = 0;
    }
    else {
      sVar1 = utf8_ptr::s_putch(*outp,ch);
      *outp = *outp + sVar1;
      sVar1 = *outlen - uVar2;
    }
    sVar3 = sVar3 + uVar2;
    *outlen = sVar1;
  }
  return sVar3;
}

Assistant:

size_t CCharmapToUniSB::map(char **outp, size_t *outlen,
                            const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte) in the input string */
    for ( ; inlen > 0 ; --inlen, ++inp)
    {
        wchar_t uni;
        size_t csiz;
        
        /* get the unicode mapping for this character */
        uni = map_[(unsigned char)*inp];

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output lenght */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);
            
            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}